

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.cpp
# Opt level: O3

FrameBuffer * __thiscall
ASDCP::FrameBuffer::SetData(FrameBuffer *this,byte_t *buf_addr,ui32_t buf_size)

{
  int in_ECX;
  undefined4 in_register_00000014;
  undefined1 *puVar1;
  
  if (CONCAT44(in_register_00000014,buf_size) == 0) {
    puVar1 = Kumu::RESULT_PTR;
    if ((in_ECX != 0) || (buf_addr[0x14] != '\0')) goto LAB_001cb774;
    buf_addr[0x14] = '\0';
    buf_addr[0x18] = '\0';
    buf_addr[0x19] = '\0';
    buf_addr[0x1a] = '\0';
    buf_addr[0x1b] = '\0';
    buf_addr[0x10] = '\0';
    buf_addr[0x11] = '\0';
    buf_addr[0x12] = '\0';
    buf_addr[0x13] = '\0';
    buf_addr[8] = '\0';
    buf_addr[9] = '\0';
    buf_addr[10] = '\0';
    buf_addr[0xb] = '\0';
    buf_addr[0xc] = '\0';
    buf_addr[0xd] = '\0';
    buf_addr[0xe] = '\0';
    buf_addr[0xf] = '\0';
  }
  else {
    if ((buf_addr[0x14] == '\x01') && (*(void **)(buf_addr + 8) != (void *)0x0)) {
      free(*(void **)(buf_addr + 8));
    }
    buf_addr[0x14] = '\0';
    *(int *)(buf_addr + 0x10) = in_ECX;
    *(ulong *)(buf_addr + 8) = CONCAT44(in_register_00000014,buf_size);
    buf_addr[0x18] = '\0';
    buf_addr[0x19] = '\0';
    buf_addr[0x1a] = '\0';
    buf_addr[0x1b] = '\0';
  }
  puVar1 = Kumu::RESULT_OK;
LAB_001cb774:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar1);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::FrameBuffer::SetData(byte_t* buf_addr, ui32_t buf_size)
{
  // if buf_addr is null and we have an external memory reference,
  // drop the reference and place the object in the initialized-
  // but-no-buffer-allocated state
  if ( buf_addr == 0 )
    {
      if ( buf_size > 0 || m_OwnMem )
	return RESULT_PTR;

      m_OwnMem = false;
      m_Capacity = m_Size = 0;
      m_Data = 0;
      return RESULT_OK;
    }

  if ( m_OwnMem && m_Data != 0 )
    free(m_Data);

  m_OwnMem = false;
  m_Capacity = buf_size;
  m_Data = buf_addr;
  m_Size = 0;

  return RESULT_OK;
}